

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMT_TK_AUTH_Unmarshal(TPMT_TK_AUTH *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar3 = 0x9a;
  if (1 < iVar1) {
    UVar2 = ByteArrayToUint16(*buffer);
    target->tag = UVar2;
    *buffer = *buffer + 2;
    if ((UVar2 == 0x8025) || (TVar3 = 0x97, UVar2 == 0x8023)) {
      TVar3 = TPMI_RH_HIERARCHY_Unmarshal(&target->hierarchy,buffer,size,1);
      if (TVar3 == 0) {
        TVar3 = TPM2B_DIGEST_Unmarshal(&target->digest,buffer,size);
        return TVar3;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMT_TK_AUTH_Unmarshal(TPMT_TK_AUTH *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ST_Unmarshal((TPM_ST *)&(target->tag), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( ((target->tag) != TPM_ST_AUTH_SIGNED)
     && ((target->tag) != TPM_ST_AUTH_SECRET))
        return TPM_RC_TAG;
    result = TPMI_RH_HIERARCHY_Unmarshal((TPMI_RH_HIERARCHY *)&(target->hierarchy), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->digest), buffer, size);
    return result;
}